

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O3

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStructNew
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,StructNew *curr)

{
  pointer pFVar1;
  Struct *pSVar2;
  pointer pFVar3;
  long lVar4;
  ulong uVar5;
  HeapType local_38;
  
  if ((curr->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements != 0) {
    local_38 = wasm::Type::getHeapType
                         (&(curr->super_SpecificExpression<(wasm::Expression::Id)65>).
                           super_Expression.type);
    pSVar2 = HeapType::getStruct(&local_38);
    pFVar3 = (pSVar2->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_start;
    pFVar1 = (pSVar2->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((long)pFVar1 - (long)pFVar3 >> 4 !=
        (curr->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
        usedElements) {
      __assert_fail("fields.size() == curr->operands.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                    ,0x371,
                    "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStructNew(StructNew *) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
                   );
    }
    if (pFVar1 != pFVar3) {
      lVar4 = 0;
      uVar5 = 0;
      do {
        if ((curr->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
            <= uVar5) {
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
                  ((ConstraintCollector *)this,
                   (Expression **)
                   ((long)(curr->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .data + lVar4),(Type)*(uintptr_t *)((long)&(pFVar3->type).id + lVar4 * 2))
        ;
        uVar5 = uVar5 + 1;
        pFVar3 = (pSVar2->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar4 = lVar4 + 8;
      } while (uVar5 < (ulong)((long)(pSVar2->fields).
                                     super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pFVar3 >> 4))
      ;
    }
  }
  return;
}

Assistant:

void visitStructNew(StructNew* curr) {
    if (curr->isWithDefault()) {
      return;
    }
    const auto& fields = curr->type.getHeapType().getStruct().fields;
    assert(fields.size() == curr->operands.size());
    for (size_t i = 0; i < fields.size(); ++i) {
      note(&curr->operands[i], fields[i].type);
    }
  }